

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const*&,char_const(&)[2],kj::StringTree,char_const(&)[2],kj::String&,char_const(&)[2],char_const*&>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          StringTree *params_2,char (*params_3) [2],String *params_4,char (*params_5) [2],
          char **params_6)

{
  ArrayDisposer *pAVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_70 = toCharSequence<char_const*&>((char **)this);
  local_80 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  local_90 = toCharSequence<char_const(&)[2]>((char (*) [2])params_2);
  pAVar1 = *(ArrayDisposer **)(params_3 + 4);
  local_40.ptr = (char *)pAVar1;
  if (pAVar1 != (ArrayDisposer *)0x0) {
    local_40.ptr = *(char **)params_3;
  }
  local_40.size_ = (size_t)(ArrayDisposer *)0x0;
  if (pAVar1 != (ArrayDisposer *)0x0) {
    local_40.size_ = (size_t)(pAVar1 + -1);
  }
  local_50 = toCharSequence<char_const(&)[2]>((char (*) [2])params_4);
  local_60 = toCharSequence<char_const*&>((char **)params_5);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_70,&local_80,
             (ArrayPtr<const_char> *)params_1,(StringTree *)&local_90,&local_40,&local_50,&local_60,
             in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}